

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  pointer *__ptr;
  ExprList init_expr;
  Location loc;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  Location local_98;
  Var local_78;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)segment_index) {
    pEVar2 = ppEVar1[segment_index];
    GetLocation(&local_98,this);
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_a8._0_4_ = Index;
    local_a8._4_4_ = 0;
    Var::Var(&local_78,func_index,&local_98);
    std::make_unique<wabt::VarExpr<(wabt::ExprType)36>,wabt::Var,wabt::Location&>
              ((Var *)local_c8,&local_78.loc);
    local_c8._8_8_ = local_c8._0_8_;
    local_c8._0_8_ = (long *)0x0;
    intrusive_list<wabt::Expr>::push_back
              ((intrusive_list<wabt::Expr> *)(local_c8 + 0x10),
               (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)(local_c8 + 8));
    if ((long *)local_c8._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8._8_8_ + 8))();
    }
    local_c8._8_8_ = (char *)0x0;
    if ((long *)local_c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
    local_c8._0_8_ = 0;
    Var::~Var(&local_78);
    std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
    emplace_back<wabt::intrusive_list<wabt::Expr>>
              ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                *)&pEVar2->elem_exprs,(intrusive_list<wabt::Expr> *)(local_c8 + 0x10));
    intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)(local_c8 + 0x10));
    return (Result)Ok;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                ,0x524,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                     Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefFuncExpr>(Var(func_index, loc), loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}